

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O1

bool __thiscall
lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
applyBestOperationAndUpdate
          (GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer pEVar4;
  mapped_type mVar5;
  pointer pmVar6;
  long lVar7;
  size_t v0;
  size_t v1;
  bool bVar8;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this_00;
  _Base_ptr p_Var9;
  size_t *psVar10;
  mapped_type *pmVar11;
  _Rb_tree_node_base *p_Var12;
  size_t *psVar13;
  _Base_ptr p_Var14;
  size_t *psVar15;
  _Base_ptr p_Var16;
  byte unaff_BPL;
  EdgeOperation *__k;
  size_t *child;
  size_t **__k_00;
  long lVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> neighbours;
  pair<const_unsigned_long,_double> w;
  EdgeOperation local_98;
  EdgeOperation local_78;
  size_t *local_58;
  _Base_ptr p_Stack_50;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *local_48;
  size_t *local_40;
  size_t *local_38;
  
  local_98.delta = (value_type_conflict2)&this->queue_;
  local_48 = &this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>;
  do {
    pEVar4 = (this->queue_).c.
             super__Vector_base<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pEVar4 == (this->queue_).c.
                  super__Vector_base<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      unaff_BPL = 0;
      break;
    }
    psVar13 = (size_t *)pEVar4->v0;
    psVar15 = (size_t *)pEVar4->v1;
    mVar5 = pEVar4->edition;
    dVar1 = pEVar4->delta;
    std::
    priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
    ::pop((priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
           *)local_98.delta);
    if (0.0 <= dVar1) {
      bVar8 = true;
      unaff_BPL = 0;
    }
    else {
      pmVar6 = (this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>).vertices_
               .
               super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(size_t *)((long)&pmVar6[(long)psVar13]._M_t._M_impl.super__Rb_tree_header + 0x20) != 0)
      {
        p_Var9 = &pmVar6[(long)psVar13]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var14 = p_Var9;
        for (p_Var16 = *(_Base_ptr *)
                        ((long)&pmVar6[(long)psVar13]._M_t._M_impl.super__Rb_tree_header + 8);
            p_Var16 != (_Base_ptr)0x0;
            p_Var16 = (&p_Var16->_M_left)[*(size_t **)(p_Var16 + 1) < psVar15]) {
          if (*(size_t **)(p_Var16 + 1) >= psVar15) {
            p_Var14 = p_Var16;
          }
        }
        p_Var16 = p_Var9;
        if ((p_Var14 != p_Var9) && (p_Var16 = p_Var14, psVar15 < *(size_t **)(p_Var14 + 1))) {
          p_Var16 = p_Var9;
        }
        if (p_Var16 != p_Var9) {
          psVar10 = psVar15;
          if (psVar13 < psVar15) {
            psVar10 = psVar13;
          }
          __k = &local_98;
          if (psVar15 < psVar13) {
            __k = &local_78;
          }
          local_98.v0 = (size_t)psVar15;
          local_78.v0 = (size_t)psVar13;
          pmVar11 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::operator[]((this->editions_).
                                 super__Vector_base<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (long)psVar10,&__k->v0)
          ;
          this_00 = local_48;
          if (mVar5 == *pmVar11) {
            lVar17 = *(long *)&(local_48->data_->problemGraph->problem_->nodes).
                               super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                               _M_impl.super__Vector_impl_data;
            iVar2 = *(int *)(lVar17 + (long)psVar13 * 0x18);
            iVar3 = *(int *)(lVar17 + (long)psVar15 * 0x18);
            if (iVar2 == iVar3) {
              DynamicLineage<std::vector<double,_std::allocator<double>_>_>::merge
                        (local_48,(size_t)psVar13,(size_t)psVar15);
            }
            else {
              psVar10 = psVar13;
              child = psVar15;
              if (((long)iVar3 + -1 == (long)iVar2) ||
                 (psVar10 = psVar15, child = psVar13, (long)iVar3 + 1 == (long)iVar2)) {
                DynamicLineage<std::vector<double,_std::allocator<double>_>_>::setParent
                          (local_48,(size_t)child,(size_t)psVar10);
              }
            }
            (this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>).objective_ =
                 dVar1 + (this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>)
                         .objective_;
            local_98.v0 = 0;
            local_98.v1 = 0;
            local_98.edition = 0;
            local_78.v0 = (size_t)psVar13;
            local_78.v1 = (size_t)psVar15;
            lVar17 = 0;
            do {
              lVar7 = *(long *)((long)&local_78.v0 + lVar17);
              pmVar6 = (this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>).
                       vertices_.
                       super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              p_Var12 = *(_Base_ptr *)
                         ((long)&pmVar6[lVar7]._M_t._M_impl.super__Rb_tree_header + 0x10);
              psVar13 = (size_t *)local_98.v0;
              while (local_98.v0 = (size_t)psVar13,
                    p_Var12 != &pmVar6[lVar7]._M_t._M_impl.super__Rb_tree_header._M_header) {
                local_58 = *(size_t **)(p_Var12 + 1);
                p_Stack_50 = p_Var12[1]._M_parent;
                if (local_98.v1 == local_98.edition) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,
                             (iterator)local_98.v1,(unsigned_long *)&local_58);
                }
                else {
                  *(size_t **)local_98.v1 = local_58;
                  local_98.v1 = local_98.v1 + 8;
                }
                p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
                psVar13 = (size_t *)local_98.v0;
              }
              lVar17 = lVar17 + 8;
            } while (lVar17 != 0x10);
            local_40 = (size_t *)local_98.v1;
            if (psVar13 != (size_t *)local_98.v1) {
              do {
                v0 = *psVar13;
                pmVar6 = (this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>)
                         .vertices_.
                         super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                for (p_Var12 = *(_Base_ptr *)
                                ((long)&pmVar6[v0]._M_t._M_impl.super__Rb_tree_header + 0x10);
                    p_Var12 != &pmVar6[v0]._M_t._M_impl.super__Rb_tree_header._M_header;
                    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
                  v1 = *(size_t *)(p_Var12 + 1);
                  increaseEdition(this,v0,v1);
                  DynamicLineage<std::vector<double,_std::allocator<double>_>_>::proposeMove
                            (&local_78,this_00,v0,v1);
                  if (local_78.delta <= 0.0) {
                    local_58 = (size_t *)local_78.v0;
                    local_38 = (size_t *)local_78.v1;
                    psVar15 = (size_t *)local_78.v1;
                    if (local_78.v0 < local_78.v1) {
                      psVar15 = (size_t *)local_78.v0;
                    }
                    __k_00 = &local_38;
                    if (local_78.v0 >= local_78.v1 && local_78.v0 != local_78.v1) {
                      __k_00 = &local_58;
                    }
                    pmVar11 = std::
                              map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              ::operator[]((this->editions_).
                                           super__Vector_base<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + (long)psVar15
                                           ,(key_type *)__k_00);
                    local_78.edition = *pmVar11;
                    std::
                    priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
                    ::push((priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
                            *)local_98.delta,&local_78);
                  }
                }
                psVar13 = psVar13 + 1;
              } while (psVar13 != local_40);
            }
            if ((size_t *)local_98.v0 != (size_t *)0x0) {
              operator_delete((void *)local_98.v0,local_98.edition - local_98.v0);
            }
            bVar8 = true;
            unaff_BPL = 1;
            goto LAB_00130c43;
          }
        }
      }
      bVar8 = false;
    }
LAB_00130c43:
  } while (!bVar8);
  return (bool)(unaff_BPL & 1);
}

Assistant:

inline bool virtual applyBestOperationAndUpdate()
    {
        while (!queue_.empty()) {

            const auto move = queue_.top();
            queue_.pop();

            if (move.delta >= 0) {
                return false;
            } else if (!this->edgeExists(move.v0, move.v1)) {
                continue;
            } else if (move.edition != getEdition(move.v0, move.v1)) {
                continue;
            }

            this->applyMove(move);

            std::vector<size_t> neighbours;
            for (auto v : { move.v0, move.v1 }) {
                for (auto w : this->vertices_[v]) {
                    neighbours.push_back(w.first);
                }
            }

            for (auto v : neighbours) {
                for (auto w : this->vertices_[v]) {
                    proposeMove(v, w.first);
                }
            }
            return true;
        }
        return false;
    }